

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O0

void __thiscall QHeaderViewPrivate::updateDefaultSectionSizeFromStyle(QHeaderViewPrivate *this)

{
  long lVar1;
  int iVar2;
  QHeaderView *pQVar3;
  QStyle *pQVar4;
  int *piVar5;
  QHeaderViewPrivate *in_RDI;
  long in_FS_OFFSET;
  QHeaderView *q;
  int in_stack_fffffffffffffff0;
  int in_stack_fffffffffffffff4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = q_func(in_RDI);
  if (in_RDI->orientation == Horizontal) {
    pQVar4 = QWidget::style((QWidget *)in_RDI);
    iVar2 = (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,0x59,0,pQVar3);
    in_RDI->defaultSectionSize = iVar2;
  }
  else {
    QHeaderView::minimumSectionSize
              ((QHeaderView *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
    pQVar4 = QWidget::style((QWidget *)in_RDI);
    (**(code **)(*(long *)pQVar4 + 0xe0))(pQVar4,0x5a,0,pQVar3);
    piVar5 = qMax<int>((int *)&stack0xfffffffffffffff4,(int *)&stack0xfffffffffffffff0);
    in_RDI->defaultSectionSize = *piVar5;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHeaderViewPrivate::updateDefaultSectionSizeFromStyle()
{
    Q_Q(QHeaderView);
    if (orientation == Qt::Horizontal) {
        defaultSectionSize = q->style()->pixelMetric(QStyle::PM_HeaderDefaultSectionSizeHorizontal, nullptr, q);
    } else {
        defaultSectionSize = qMax(q->minimumSectionSize(),
                                  q->style()->pixelMetric(QStyle::PM_HeaderDefaultSectionSizeVertical, nullptr, q));
    }
}